

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_discard_rectangles
          (Impl *this,Value *state,VkPipelineDiscardRectangleStateCreateInfoEXT **out_info)

{
  Number in_RAX;
  VkPipelineDiscardRectangleStateCreateInfoEXT *pVVar1;
  Type pGVar2;
  Number NVar3;
  undefined8 local_28;
  
  local_28 = in_RAX;
  pVVar1 = (VkPipelineDiscardRectangleStateCreateInfoEXT *)
           ScratchAllocator::allocate_raw(&this->allocator,0x28,0x10);
  if (pVVar1 != (VkPipelineDiscardRectangleStateCreateInfoEXT *)0x0) {
    pVVar1->flags = 0;
    pVVar1->discardRectangleMode = VK_DISCARD_RECTANGLE_MODE_INCLUSIVE_EXT;
    *(undefined8 *)&pVVar1->discardRectangleCount = 0;
    *(undefined8 *)pVVar1 = 0;
    pVVar1->pNext = (void *)0x0;
    pVVar1->pDiscardRectangles = (VkRect2D *)0x0;
  }
  *out_info = pVVar1;
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"flags");
  if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    pVVar1->flags = (pGVar2->data_).s.length;
    pGVar2 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"discardRectangleMode");
    if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) !=
        (undefined1  [16])0x0) {
      pVVar1->discardRectangleMode = (pGVar2->data_).s.length;
      pGVar2 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)state,"discardRectangleCount");
      if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000)
          != (undefined1  [16])0x0) {
        pVVar1->discardRectangleCount = (pGVar2->data_).s.length;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&stack0xffffffffffffffd8,(Ch *)state);
        NVar3.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(state);
        if (local_28 != NVar3.i64) {
          pGVar2 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)state,"discardRectangles");
          parse_scissors(this,pGVar2,&pVVar1->pDiscardRectangles);
        }
        return true;
      }
    }
  }
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x719,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_discard_rectangles(const Value &state,
                                                   VkPipelineDiscardRectangleStateCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkPipelineDiscardRectangleStateCreateInfoEXT>();
	*out_info = info;

	info->flags = static_cast<VkPipelineDiscardRectangleStateCreateFlagsEXT>(state["flags"].GetUint());
	info->discardRectangleMode = static_cast<VkDiscardRectangleModeEXT>(state["discardRectangleMode"].GetUint());
	info->discardRectangleCount = state["discardRectangleCount"].GetUint();

	// Could be null for dynamic state.
	if (state.HasMember("discardRectangles"))
	{
		if (!parse_scissors(state["discardRectangles"], &info->pDiscardRectangles))
			return false;
	}

	return true;
}